

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

uint32_t __thiscall
diligent_spirv_cross::Compiler::get_extended_member_decoration
          (Compiler *this,uint32_t type,uint32_t index,ExtendedDecorations decoration)

{
  Decoration *pDVar1;
  Meta *pMVar2;
  _Node_iterator_base<unsigned_int,_false> _Var3;
  uint32_t *puVar4;
  ulong uVar5;
  ExtendedDecorations local_1c;
  
  pMVar2 = ParsedIR::find_meta(&this->ir,(ID)type);
  if (pMVar2 == (Meta *)0x0) {
    return 0;
  }
  uVar5 = (ulong)index;
  if (uVar5 < (pMVar2->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.buffer_size
     ) {
    pDVar1 = (pMVar2->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.ptr;
    if (decoration < 0x40) {
      _Var3._M_cur = (__node_type *)
                     (pDVar1[uVar5].extended.flags.lower >> ((ulong)decoration & 0x3f) & 1);
    }
    else {
      local_1c = decoration;
      _Var3._M_cur = (__node_type *)
                     ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find(&pDVar1[uVar5].extended.flags.higher._M_h,&local_1c);
    }
    if (_Var3._M_cur == (__node_type *)0x0) {
      if (5 < decoration - SPIRVCrossDecorationInterfaceMemberIndex) {
        return 0;
      }
      puVar4 = (uint32_t *)
               (&DAT_009213bc + (ulong)(decoration - SPIRVCrossDecorationInterfaceMemberIndex) * 4);
    }
    else {
      puVar4 = pDVar1[uVar5].extended.values + decoration;
    }
    return *puVar4;
  }
  return 0;
}

Assistant:

uint32_t Compiler::get_extended_member_decoration(uint32_t type, uint32_t index, ExtendedDecorations decoration) const
{
	auto *m = ir.find_meta(type);
	if (!m)
		return 0;

	if (index >= m->members.size())
		return 0;

	auto &dec = m->members[index];
	if (!dec.extended.flags.get(decoration))
		return get_default_extended_decoration(decoration);
	return dec.extended.values[decoration];
}